

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_file.cpp
# Opt level: O1

I32 Omega_h::binary::read_nparts(path *path,CommPtr *comm)

{
  char cVar1;
  I32 IVar2;
  value_type *pvVar3;
  char *format;
  I32 nparts;
  path filepath;
  ifstream file;
  I32 local_244;
  path local_240;
  path local_220;
  byte abStack_200 [488];
  
  IVar2 = Comm::rank((comm->super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>)._M_ptr);
  if (IVar2 != 0) {
LAB_002bd33f:
    Comm::bcast<int>((comm->super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>)._M_ptr,
                     &local_244,0);
    return local_244;
  }
  filesystem::path::path(&local_220,"nparts");
  filesystem::operator/(&local_240,path,&local_220);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_220.impl._M_dataplus._M_p != &local_220.impl.field_2) {
    operator_delete(local_220.impl._M_dataplus._M_p,local_220.impl.field_2._M_allocated_capacity + 1
                   );
  }
  pvVar3 = filesystem::path::c_str(&local_240);
  std::ifstream::ifstream(&local_220,pvVar3,_S_in);
  cVar1 = std::__basic_file<char>::is_open();
  if (cVar1 == '\0') {
    format = "could not open file \"%s\"\n";
  }
  else {
    std::istream::operator>>((istream *)&local_220,&local_244);
    if ((abStack_200[*(long *)(local_220.impl._M_dataplus._M_p + -0x18)] & 5) == 0) {
      std::ifstream::~ifstream(&local_220);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_240.impl._M_dataplus._M_p != &local_240.impl.field_2) {
        operator_delete(local_240.impl._M_dataplus._M_p,
                        local_240.impl.field_2._M_allocated_capacity + 1);
      }
      goto LAB_002bd33f;
    }
    format = "could not read file \"%s\"\n";
  }
  pvVar3 = filesystem::path::c_str(&local_240);
  fail(format,pvVar3);
}

Assistant:

I32 read_nparts(filesystem::path const& path, CommPtr comm) {
  I32 nparts;
  if (comm->rank() == 0) {
    auto const filepath = path / "nparts";
    std::ifstream file(filepath.c_str());
    if (!file.is_open()) {
      Omega_h_fail("could not open file \"%s\"\n", filepath.c_str());
    }
    file >> nparts;
    if (!file) {
      Omega_h_fail("could not read file \"%s\"\n", filepath.c_str());
    }
  }
  comm->bcast(nparts);
  return nparts;
}